

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::MILSpec::Operation::_InternalParse
          (Operation *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  internal *this_00;
  size_t size;
  Rep *pRVar3;
  bool bVar4;
  string *s;
  NamedValueType *obj;
  Block *obj_00;
  MessageLite *pMVar5;
  uint uVar6;
  char *field_name;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *msg;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar8;
  char cVar9;
  uint res;
  pair<const_char_*,_unsigned_int> pVar10;
  StringPiece str;
  byte *local_58;
  InternalMetadata *local_50;
  ArenaStringPtr *local_48;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *local_40;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *local_38;
  
  local_58 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  if (!bVar4) {
    msg = &this->attributes_;
    local_38 = &this->inputs_;
    local_50 = &(this->super_MessageLite)._internal_metadata_;
    local_48 = &this->type_;
    local_40 = msg;
    do {
      bVar1 = *local_58;
      res = (uint)bVar1;
      pbVar8 = local_58 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar8 * 0x80) - 0x80;
        if ((char)*pbVar8 < '\0') {
          pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_58,res);
          pbVar8 = (byte *)pVar10.first;
          res = pVar10.second;
        }
        else {
          pbVar8 = local_58 + 2;
        }
      }
      uVar6 = (res >> 3) - 1;
      local_58 = pbVar8;
      if (uVar6 < 5) {
        field_name = (char *)((long)&switchD_00204d8c::switchdataD_003a0780 +
                             (long)(int)(&switchD_00204d8c::switchdataD_003a0780)[uVar6]);
        cVar9 = (char)res;
        switch(res >> 3) {
        case 1:
          if (cVar9 != '\n') goto switchD_00204d8c_default;
          puVar7 = (undefined8 *)(local_50->ptr_ & 0xfffffffffffffffc);
          if ((local_50->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_48,puVar7);
          local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (s,(char *)local_58,ctx);
          this_00 = (internal *)(s->_M_dataplus)._M_p;
          size = s->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
          msg = local_40;
          if (!bVar4) {
            return (char *)0x0;
          }
          goto joined_r0x00204fab;
        case 2:
          if (cVar9 != '\x12') goto switchD_00204d8c_default;
          local_58 = pbVar8 + -1;
          do {
            local_58 = local_58 + 1;
            local_58 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                         (ctx,local_38,(char *)local_58);
            if (local_58 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x12));
          break;
        case 3:
          if (cVar9 != '\x1a') goto switchD_00204d8c_default;
          local_58 = pbVar8 + -1;
          do {
            local_58 = local_58 + 1;
            pRVar3 = (this->outputs_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_00204e7f:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::MILSpec::NamedValueType>
                              ((this->outputs_).super_RepeatedPtrFieldBase.arena_);
              pMVar5 = (MessageLite *)
                       google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&(this->outputs_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar2 = (this->outputs_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar2) goto LAB_00204e7f;
              (this->outputs_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pMVar5 = (MessageLite *)pRVar3->elements[iVar2];
            }
            local_58 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,pMVar5,(char *)local_58);
            if (local_58 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x1a));
          break;
        case 4:
          if (cVar9 != '\"') goto switchD_00204d8c_default;
          local_58 = pbVar8 + -1;
          do {
            local_58 = local_58 + 1;
            pRVar3 = (this->blocks_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_00204ef8:
              obj_00 = google::protobuf::Arena::
                       CreateMaybeMessage<CoreML::Specification::MILSpec::Block>
                                 ((this->blocks_).super_RepeatedPtrFieldBase.arena_);
              pMVar5 = (MessageLite *)
                       google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&(this->blocks_).super_RepeatedPtrFieldBase,obj_00);
            }
            else {
              iVar2 = (this->blocks_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar2) goto LAB_00204ef8;
              (this->blocks_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pMVar5 = (MessageLite *)pRVar3->elements[iVar2];
            }
            local_58 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,pMVar5,(char *)local_58);
            if (local_58 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x22));
          break;
        case 5:
          if (cVar9 != '*') goto switchD_00204d8c_default;
          local_58 = pbVar8 + -1;
          do {
            local_58 = local_58 + 1;
            local_58 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                         (ctx,msg,(char *)local_58);
            if (local_58 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == 0x2a));
        }
      }
      else {
switchD_00204d8c_default:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar8 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar8;
        }
        if ((local_50->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_50);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((local_50->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_58,ctx);
joined_r0x00204fab:
        if (local_58 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_58;
}

Assistant:

const char* Operation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string type = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(&inputs_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_outputs(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_blocks(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(&attributes_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}